

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# act_wiz.c
# Opt level: O0

void do_limcounter(CHAR_DATA *ch,char *argument)

{
  bool bVar1;
  uint uVar2;
  OBJ_INDEX_DATA *pOVar3;
  char *in_RSI;
  int vnum;
  char buf [200];
  OBJ_INDEX_DATA *pObjIndex;
  char *in_stack_ffffffffffffff08;
  undefined4 in_stack_ffffffffffffff18;
  int in_stack_ffffffffffffff1c;
  char *in_stack_ffffffffffffff20;
  
  bVar1 = is_number(in_stack_ffffffffffffff08);
  if (bVar1) {
    uVar2 = atoi(in_RSI);
    pOVar3 = get_obj_index(in_stack_ffffffffffffff1c);
    if (pOVar3 == (OBJ_INDEX_DATA *)0x0) {
      send_to_char(in_stack_ffffffffffffff20,
                   (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
    }
    else {
      sprintf(&stack0xffffffffffffff18,"Obj vnum %d,Max: %d, Count %d.",(ulong)uVar2,
              (ulong)(uint)(int)pOVar3->limtotal,(ulong)(uint)(int)pOVar3->limcount);
      send_to_char(in_stack_ffffffffffffff20,
                   (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
      send_to_char(in_stack_ffffffffffffff20,
                   (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
    }
  }
  else {
    send_to_char(in_stack_ffffffffffffff20,
                 (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
  }
  return;
}

Assistant:

void do_limcounter(CHAR_DATA *ch, char *argument)
{
	OBJ_INDEX_DATA *pObjIndex;
	char buf[200];
	int vnum;

	if (!is_number(argument))
	{
		send_to_char("Only limstat by vnums.\n\r", ch);
		return;
	}

	vnum = atoi(argument);

	pObjIndex = get_obj_index(vnum);

	if (pObjIndex == nullptr)
	{
		send_to_char("Not found.\n\r", ch);
		return;
	}

	sprintf(buf, "Obj vnum %d,Max: %d, Count %d.", vnum, pObjIndex->limtotal, pObjIndex->limcount);
	send_to_char(buf, ch);
	send_to_char("\n\r", ch);
}